

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O0

void __thiscall
amrex::StreamRetry::StreamRetry(StreamRetry *this,ostream *a_os,string *a_suffix,int a_maxtries)

{
  undefined4 in_ECX;
  string *in_RDX;
  undefined8 in_RSI;
  undefined4 *in_RDI;
  undefined1 auVar1 [16];
  
  *in_RDI = 0;
  in_RDI[1] = in_ECX;
  std::__cxx11::string::string((string *)(in_RDI + 4));
  *(undefined8 *)(in_RDI + 0xc) = in_RSI;
  auVar1 = std::ostream::tellp();
  *(undefined1 (*) [16])(in_RDI + 0xe) = auVar1;
  std::__cxx11::string::string((string *)(in_RDI + 0x12),in_RDX);
  return;
}

Assistant:

amrex::StreamRetry::StreamRetry(std::ostream &a_os, const std::string &a_suffix,
                                 const int a_maxtries)
    : tries(0), maxTries(a_maxtries), sros(a_os), spos(a_os.tellp()), suffix(a_suffix)
{
}